

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O2

void __thiscall leveldb::TableBuilder::Rep::~Rep(Rep *this)

{
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  BlockBuilder::~BlockBuilder(&this->index_block);
  BlockBuilder::~BlockBuilder(&this->data_block);
  Status::~Status(&this->status);
  return;
}

Assistant:

Rep(const Options& opt, WritableFile* f)
      : options(opt),
        index_block_options(opt),
        file(f),
        offset(0),
        data_block(&options),
        index_block(&index_block_options),
        num_entries(0),
        closed(false),
        filter_block(opt.filter_policy == nullptr
                         ? nullptr
                         : new FilterBlockBuilder(opt.filter_policy)),
        pending_index_entry(false) {
    index_block_options.block_restart_interval = 1;
  }